

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_var_expression_t *expr)

{
  expression_type_t eVar1;
  pointer plVar2;
  iterator iVar3;
  vector<long,_std::allocator<long>_> *this_00;
  ulong local_48;
  string local_40;
  
  eVar1 = (expr->super_typed_lvalue_expression_t).super_typed_expression_t._type;
  if ((EXPR_TYPE_CLKARRAY < eVar1) ||
     ((0x33cU >> (eVar1 & (EXPR_TYPE_CONJUNCTIVE_FORMULA|EXPR_TYPE_CLKCONSTR_DIAGONAL)) & 1) == 0))
  {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"a variable","");
    invalid_expression(this,(typed_expression_t *)expr,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  local_48 = 5;
  this_00 = (this->_bytecode_back_inserter).container;
  iVar3._M_current =
       (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  plVar2 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == plVar2) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (this_00,iVar3,(long *)&local_48);
    this_00 = (this->_bytecode_back_inserter).container;
    iVar3._M_current =
         (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    plVar2 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 5;
    iVar3._M_current = iVar3._M_current + 1;
    (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  local_48 = (ulong)expr->_id;
  if (iVar3._M_current == plVar2) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (this_00,iVar3,(long *)&local_48);
  }
  else {
    *iVar3._M_current = local_48;
    (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_var_expression_t const & expr)
  {
    if ((expr.type() != tchecker::EXPR_TYPE_CLKVAR) && (expr.type() != tchecker::EXPR_TYPE_INTVAR) &&
        (expr.type() != tchecker::EXPR_TYPE_LOCALINTVAR) && (expr.type() != tchecker::EXPR_TYPE_CLKARRAY) &&
        (expr.type() != tchecker::EXPR_TYPE_INTARRAY) && (expr.type() != tchecker::EXPR_TYPE_LOCALINTARRAY))
      invalid_expression(expr, "a variable");

    // Write bytecode
    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = expr.id();
  }